

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_import.cpp
# Opt level: O2

unique_ptr<duckdb::PragmaStatement,_std::default_delete<duckdb::PragmaStatement>,_true> __thiscall
duckdb::Transformer::TransformImport(Transformer *this,PGImportStmt *stmt)

{
  pointer pPVar1;
  pointer pPVar2;
  long in_RDX;
  _Head_base<0UL,_duckdb::ConstantExpression_*,_false> local_60;
  Value local_58;
  
  make_uniq<duckdb::PragmaStatement>();
  pPVar1 = unique_ptr<duckdb::PragmaStatement,_std::default_delete<duckdb::PragmaStatement>,_true>::
           operator->((unique_ptr<duckdb::PragmaStatement,_std::default_delete<duckdb::PragmaStatement>,_true>
                       *)this);
  pPVar2 = unique_ptr<duckdb::PragmaInfo,_std::default_delete<duckdb::PragmaInfo>,_true>::operator->
                     (&pPVar1->info);
  ::std::__cxx11::string::assign((char *)&pPVar2->name);
  pPVar1 = unique_ptr<duckdb::PragmaStatement,_std::default_delete<duckdb::PragmaStatement>,_true>::
           operator->((unique_ptr<duckdb::PragmaStatement,_std::default_delete<duckdb::PragmaStatement>,_true>
                       *)this);
  pPVar2 = unique_ptr<duckdb::PragmaInfo,_std::default_delete<duckdb::PragmaInfo>,_true>::operator->
                     (&pPVar1->info);
  Value::Value(&local_58,*(char **)(in_RDX + 8));
  make_uniq<duckdb::ConstantExpression,duckdb::Value>((duckdb *)&local_60,&local_58);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ConstantExpression,std::default_delete<duckdb::ConstantExpression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              *)&pPVar2->parameters,
             (unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
              *)&local_60);
  if (local_60._M_head_impl != (ConstantExpression *)0x0) {
    (*((local_60._M_head_impl)->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[1]
    )();
  }
  local_60._M_head_impl = (ConstantExpression *)0x0;
  Value::~Value(&local_58);
  return (unique_ptr<duckdb::PragmaStatement,_std::default_delete<duckdb::PragmaStatement>_>)
         (unique_ptr<duckdb::PragmaStatement,_std::default_delete<duckdb::PragmaStatement>_>)this;
}

Assistant:

unique_ptr<PragmaStatement> Transformer::TransformImport(duckdb_libpgquery::PGImportStmt &stmt) {
	auto result = make_uniq<PragmaStatement>();
	result->info->name = "import_database";
	result->info->parameters.emplace_back(make_uniq<ConstantExpression>(Value(stmt.filename)));
	return result;
}